

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O0

int __thiscall dit::DecppTests::init(DecppTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SelfCheckCase *pSVar1;
  DecppTests *this_local;
  
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"block_buffer",
             "de::BlockBuffer_selfTest()",de::BlockBuffer_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"file_path",
             "de::FilePath_selfTest()",de::FilePath_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"pool_array",
             "de::PoolArray_selfTest()",de::PoolArray_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ring_buffer",
             "de::RingBuffer_selfTest()",de::RingBuffer_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"shared_ptr",
             "de::SharedPtr_selfTest()",de::SharedPtr_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"thread_safe_ring_buffer",
             "de::ThreadSafeRingBuffer_selfTest()",de::ThreadSafeRingBuffer_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unique_ptr",
             "de::UniquePtr_selfTest()",de::UniquePtr_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"random",
             "de::Random_selfTest()",de::Random_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"commandline",
             "de::cmdline::selfTest()",de::cmdline::selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"array_buffer",
             "de::ArrayBuffer_selfTest()",de::ArrayBuffer_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"string_util",
             "de::StringUtil_selfTest()",de::StringUtil_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"spin_barrier",
             "de::SpinBarrier_selfTest()",de::SpinBarrier_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"stl_util",
             "de::STLUtil_selfTest()",de::STLUtil_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"append_list",
             "de::AppendList_selfTest()",de::AppendList_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "block_buffer",				"de::BlockBuffer_selfTest()",			de::BlockBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "file_path",					"de::FilePath_selfTest()",				de::FilePath_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "pool_array",					"de::PoolArray_selfTest()",				de::PoolArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "ring_buffer",				"de::RingBuffer_selfTest()",			de::RingBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "shared_ptr",					"de::SharedPtr_selfTest()",				de::SharedPtr_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "thread_safe_ring_buffer",	"de::ThreadSafeRingBuffer_selfTest()",	de::ThreadSafeRingBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "unique_ptr",					"de::UniquePtr_selfTest()",				de::UniquePtr_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "random",						"de::Random_selfTest()",				de::Random_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "commandline",				"de::cmdline::selfTest()",				de::cmdline::selfTest));
		addChild(new SelfCheckCase(m_testCtx, "array_buffer",				"de::ArrayBuffer_selfTest()",			de::ArrayBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "string_util",				"de::StringUtil_selfTest()",			de::StringUtil_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "spin_barrier",				"de::SpinBarrier_selfTest()",			de::SpinBarrier_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "stl_util",					"de::STLUtil_selfTest()",				de::STLUtil_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "append_list",				"de::AppendList_selfTest()",			de::AppendList_selfTest));
	}